

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O2

void listCombination(int n,int t)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  int iVar4;
  uint i;
  
  p = Vec_IntAlloc(t + 3);
  for (iVar4 = -1; iVar4 < t; iVar4 = iVar4 + 1) {
    Vec_IntPush(p,iVar4);
  }
  Vec_IntPush(p,n);
  Vec_IntPush(p,0);
  while( true ) {
    printf("Comb-%3d : ");
    for (i = t; 0 < (int)i; i = i - 1) {
      uVar1 = Vec_IntEntry(p,i);
      printf("vC[%d] = %d ",(ulong)i,(ulong)uVar1);
    }
    putchar(10);
    iVar4 = 1;
    while( true ) {
      iVar2 = Vec_IntEntry(p,iVar4);
      iVar3 = Vec_IntEntry(p,iVar4 + 1);
      if (iVar2 + 1 != iVar3) break;
      Vec_IntWriteEntry(p,iVar4,iVar4 + -1);
      iVar4 = iVar4 + 1;
    }
    if (t < iVar4) break;
    iVar2 = Vec_IntEntry(p,iVar4);
    Vec_IntWriteEntry(p,iVar4,iVar2 + 1);
  }
  Vec_IntFree(p);
  return;
}

Assistant:

void listCombination(int n, int t)
{
	Vec_Int_t *vC;
	int i, j, combCounter = 0;

	//Initialization
	vC = Vec_IntAlloc(t+3);
	for(i=-1; i<t; i++)
		Vec_IntPush( vC, i );
	Vec_IntPush( vC, n );
	Vec_IntPush( vC, 0 );

	while(1)
	{
		//visit combination
		printf("Comb-%3d : ", ++combCounter);
		for( i=t; i>0; i--)
			printf("vC[%d] = %d ", i, Vec_IntEntry(vC, i));
		printf("\n");

		j = 1;
		while( Vec_IntEntry( vC, j ) + 1 == Vec_IntEntry( vC, j+1 ) )
		{
			//printf("\nGochon = %d, %d\n", Vec_IntEntry( vC, j ) + 1, Vec_IntEntry( vC, j+1 ));
			Vec_IntWriteEntry( vC, j, j-1 );
			j = j + 1;
		}
		if( j > t ) break;
		Vec_IntWriteEntry( vC, j, Vec_IntEntry( vC, j ) + 1 );
	}
	
	Vec_IntFree(vC);	
}